

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::analyse_function_call(Analyser *this)

{
  bool bVar1;
  TokenType TVar2;
  Token *pTVar3;
  Error *pEVar4;
  ulong uVar5;
  size_type sVar6;
  long lVar7;
  Instruction local_1bc;
  undefined1 local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  optional<Token> local_188;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158;
  optional<Token> local_138;
  int local_110;
  undefined1 local_10a;
  allocator<char> local_109;
  int i;
  optional<Token> local_e8;
  undefined1 local_c0 [8];
  vector<char,_std::allocator<char>_> para;
  undefined1 local_a0 [4];
  int index;
  undefined1 local_90 [8];
  string func;
  string local_68;
  undefined1 local_38 [8];
  optional<Token> next;
  Analyser *this_local;
  
  next.super__Optional_base<Token,_false,_false>._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._32_8_ =
       this;
  nextToken((optional<Token> *)local_38,this);
  bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
  if (bVar1) {
    pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
    TVar2 = Token::GetType(pTVar3);
    if (TVar2 == IDENTIFIER) {
      std::optional<Token>::value((optional<Token> *)local_38);
      Token::GetValue((Token *)local_a0);
      std::any_cast<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 (any *)local_a0);
      std::any::~any((any *)local_a0);
      para.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
           getFunctionIndex(this,(string *)local_90);
      getFunctionParameter((vector<char,_std::allocator<char>_> *)local_c0,this,(string *)local_90);
      nextToken(&local_e8,this);
      std::optional<Token>::operator=((optional<Token> *)local_38,&local_e8);
      std::optional<Token>::~optional(&local_e8);
      bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
      if (bVar1) {
        pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
        TVar2 = Token::GetType(pTVar3);
        if (TVar2 == LEFT_BRACKET) {
          local_110 = 0;
          do {
            uVar5 = (ulong)local_110;
            sVar6 = std::vector<char,_std::allocator<char>_>::size
                              ((vector<char,_std::allocator<char>_> *)local_c0);
            if (sVar6 <= uVar5) {
              nextToken(&local_188,this);
              std::optional<Token>::operator=((optional<Token> *)local_38,&local_188);
              std::optional<Token>::~optional(&local_188);
              bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
              if (bVar1) {
                pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
                TVar2 = Token::GetType(pTVar3);
                if (TVar2 == RIGHT_BRACKET) {
                  Instruction::Instruction
                            (&local_1bc,call,
                             para.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
                  addInstruction(this,&local_1bc);
                  std::vector<char,_std::allocator<char>_>::~vector
                            ((vector<char,_std::allocator<char>_> *)local_c0);
                  std::__cxx11::string::~string((string *)local_90);
                  std::optional<Token>::~optional((optional<Token> *)local_38);
                  return;
                }
              }
              local_1aa = 1;
              pEVar4 = (Error *)__cxa_allocate_exception(0x28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a8,"Missing \')\'",&local_1a9);
              Error::Error(pEVar4,&local_1a8,(long)this->_currentLine);
              local_1aa = 0;
              __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
            }
            analyse_expression(this);
            lVar7 = (long)local_110;
            sVar6 = std::vector<char,_std::allocator<char>_>::size
                              ((vector<char,_std::allocator<char>_> *)local_c0);
            if (lVar7 != sVar6 - 1) {
              nextToken(&local_138,this);
              std::optional<Token>::operator=((optional<Token> *)local_38,&local_138);
              std::optional<Token>::~optional(&local_138);
              bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
              if (!bVar1) {
LAB_00129c56:
                local_15a = 1;
                pEVar4 = (Error *)__cxa_allocate_exception(0x28);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_158,"Missing \',\'",&local_159);
                Error::Error(pEVar4,&local_158,(long)this->_currentLine);
                local_15a = 0;
                __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
              }
              pTVar3 = std::optional<Token>::value((optional<Token> *)local_38);
              TVar2 = Token::GetType(pTVar3);
              if (TVar2 != COMMA_SIGH) goto LAB_00129c56;
            }
            local_110 = local_110 + 1;
          } while( true );
        }
      }
      local_10a = 1;
      pEVar4 = (Error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&i,"Missing \'(\'",&local_109);
      Error::Error(pEVar4,(string *)&i,(long)this->_currentLine);
      local_10a = 0;
      __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
    }
  }
  func.field_2._M_local_buf[0xe] = '\x01';
  pEVar4 = (Error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Missing identifier",
             (allocator<char> *)(func.field_2._M_local_buf + 0xf));
  Error::Error(pEVar4,&local_68,(long)this->_currentLine);
  func.field_2._M_local_buf[0xe] = '\0';
  __cxa_throw(pEVar4,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::analyse_function_call() {
	//<identifier>
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::IDENTIFIER) {
		throw Error("Missing identifier", _currentLine);
	}
	std::string func = std::any_cast<std::string>(next.value().GetValue());
	int index = getFunctionIndex(func);
	std::vector<char> para = getFunctionParameter(func);
	//'('
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::LEFT_BRACKET) {
		throw Error("Missing '('", _currentLine);
	}
	//<expression-list>
	for (int i = 0; i < para.size(); i++) {
		analyse_expression();
		if (i != para.size() - 1) {
			next = nextToken();
			if (!next.has_value() || next.value().GetType() != TokenType::COMMA_SIGH) {
				throw Error("Missing ','", _currentLine);
			}
		}
	}
	//')'
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
		throw Error("Missing ')'", _currentLine);
	}
	addInstruction(Instruction(Operation::call, index));
}